

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O1

binarydata * __thiscall
NetworkDataType::serializedata<std::__cxx11::string_const,std::vector<int,std::allocator<int>>const>
          (binarydata *__return_storage_ptr__,NetworkDataType *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          vector<int,_std::allocator<int>_> *args_1)

{
  PortableBinaryOutputArchive *pPVar1;
  pointer data;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string local_2d0;
  PortableBinaryOutputArchive local_2b0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_2d0._M_dataplus._M_p._0_1_ =
       cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (&local_2b0,(ostream *)local_1a0,(Options *)&local_2d0);
  pPVar1 = ((((((local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  local_2d0._M_dataplus._M_p = (pointer)this[1]._vptr_NetworkDataType;
  cereal::PortableBinaryOutputArchive::saveBinary<8ul>
            ((((((((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)
                     ->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                   super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                 super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&local_2d0,8);
  cereal::PortableBinaryOutputArchive::saveBinary<1ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
             this->_vptr_NetworkDataType,(size_t)this[1]._vptr_NetworkDataType);
  pPVar1 = ((((((local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  local_2d0._M_dataplus._M_p =
       (pointer)((long)(args->_M_string_length - (long)(args->_M_dataplus)._M_p) >> 2);
  cereal::PortableBinaryOutputArchive::saveBinary<8ul>
            ((((((((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)
                     ->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                   super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                 super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&local_2d0,8);
  data = (args->_M_dataplus)._M_p;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,data,
             args->_M_string_length - (long)data);
  std::__cxx11::stringbuf::str();
  binarydata::binarydata(__return_storage_ptr__,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.super_OutputArchiveBase.
  _vptr_OutputArchiveBase = (_func_int **)&PTR__OutputArchive_002e7778;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsVersionedTypes._M_h);
  std::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_std::allocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_char_*>,_std::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsPolymorphicTypeMap._M_h);
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_unsigned_int>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsSharedPointerMap._M_h);
  std::
  _Hashtable<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id,_std::allocator<cereal::traits::detail::base_class_id>,_std::__detail::_Identity,_std::equal_to<cereal::traits::detail::base_class_id>,_cereal::traits::detail::base_class_id_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2b0.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.
                 itsBaseClassSet._M_h);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }